

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  longdouble lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar4;
  ulong uVar5;
  longdouble *plVar6;
  int extraout_var_01;
  longdouble *plVar7;
  longdouble *plVar8;
  long lVar3;
  
  iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = lVar3;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = CONCAT44(extraout_var_00,iVar2);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSFMatrix_01868de0;
  if (lVar3 != CONCAT44(extraout_var_00,iVar2)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot call TPZBaseMatrix::Dim() for a non-square ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"matrix! Aborting...",0x13);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzbasematrix.h"
               ,0x4f);
  }
  iVar4 = TPZBaseMatrix::Dim((TPZBaseMatrix *)this);
  uVar5 = (iVar4 + 1) * lVar3 >> 1;
  plVar6 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
  this->fElem = plVar6;
  plVar8 = A->fElem;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  if (CONCAT44(extraout_var_01,iVar2) != 0 && -1 < extraout_var_01) {
    plVar7 = plVar6 + CONCAT44(extraout_var_01,iVar2);
    do {
      lVar1 = *plVar8;
      plVar8 = plVar8 + 1;
      *plVar6 = lVar1;
      plVar6 = plVar6 + 1;
    } while (plVar6 < plVar7);
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix (const TPZSFMatrix<TVar>  & A)
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A.Dim(), A.Dim() )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[Size()];
	while ( dst < end )
		*dst++ = *src++;
}